

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Launcher.cpp
# Opt level: O3

shared_ptr<Engine> __thiscall Launcher::getAggregateEngine(Launcher *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<Engine> sVar2;
  shared_ptr<Engine> sVar3;
  
  in_RDI->_vptr_Engine =
       (_func_int **)(this->_engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->_engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  in_RDI[1]._vptr_Engine = (_func_int **)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      sVar2.super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<Engine>)sVar2.super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Engine>)sVar3.super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Engine> Launcher::getAggregateEngine()
{
	return _engine;
}